

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> * __thiscall
Json::Reader::getStructuredErrors
          (vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
           *__return_storage_ptr__,Reader *this)

{
  Location pCVar1;
  _Elt_pointer pEVar2;
  ErrorInfo *error;
  _Elt_pointer pEVar3;
  _Map_pointer ppEVar4;
  undefined1 auVar5 [16];
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar3 = (this->errors_).
           super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pEVar3 != (this->errors_).
                super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pEVar2 = (this->errors_).
             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    ppEVar4 = (this->errors_).
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      pCVar1 = this->begin_;
      auVar5._8_4_ = (int)pCVar1;
      auVar5._0_8_ = pCVar1;
      auVar5._12_4_ = (int)((ulong)pCVar1 >> 0x20);
      local_68._0_8_ = (long)(pEVar3->token_).start_ - (long)pCVar1;
      local_68._8_8_ = (long)(pEVar3->token_).end_ - auVar5._8_8_;
      local_58._M_p = (pointer)&local_48;
      std::__cxx11::string::_M_assign((string *)&local_58);
      std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
      push_back(__return_storage_ptr__,(value_type *)local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,
                        CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
        ;
      }
      pEVar3 = pEVar3 + 1;
      if (pEVar3 == pEVar2) {
        pEVar3 = ppEVar4[1];
        ppEVar4 = ppEVar4 + 1;
        pEVar2 = pEVar3 + 8;
      }
    } while (pEVar3 != (this->errors_).
                       super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Reader::StructuredError> Reader::getStructuredErrors() const {
  std::vector<Reader::StructuredError> allErrors;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    Reader::StructuredError structured;
    structured.offset_start = error.token_.start_ - begin_;
    structured.offset_limit = error.token_.end_ - begin_;
    structured.message = error.message_;
    allErrors.push_back(structured);
  }
  return allErrors;
}